

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::SerializeInternal
               (uint8 *base,FieldMetadata *field_metadata_table,int32 num_fields,
               CodedOutputStream *output)

{
  double *field;
  uint field_00;
  float fVar1;
  ulong uVar2;
  uint32 *has_bits_array;
  bool bVar3;
  
  uVar2 = 0;
  if (0 < num_fields) {
    uVar2 = (ulong)(uint)num_fields;
  }
  do {
    bVar3 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar3) {
      return;
    }
    field_00 = field_metadata_table->type;
    if (0x69 < field_00) {
switchD_0025b0b6_caseD_12:
      SerializeNotImplemented(field_00);
      goto LAB_0025b855;
    }
    field = (double *)(base + field_metadata_table->offset);
    switch(field_00) {
    case 0:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b823:
        SingularFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 1:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b774:
        SingularFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 2:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b483:
        SingularFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 3:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b503:
        SingularFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 4:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b3f7;
    case 5:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b611:
        SingularFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 6:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b3e9;
    case 7:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b418:
        SingularFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 8:
    case 0xb:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b113:
        SingularFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 9:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b45d:
        SingularFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 10:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b7de:
        SingularFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0xc:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b4f2;
    case 0xd:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b2e6;
    case 0xe:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b3b1;
    case 0xf:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b841:
        SingularFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x10:
      fVar1 = (float)(*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
                      (field_metadata_table->has_offset & 0x1f) & 1);
      goto joined_r0x0025b7a7;
    case 0x11:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b6d7:
        SingularFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    default:
      goto switchD_0025b0b6_caseD_12;
    case 0x14:
      if ((*(uint *)(base + (ulong)(field_metadata_table->has_offset >> 5) * 4) >>
           (field_metadata_table->has_offset & 0x1f) & 1) != 0) {
LAB_0025b62c:
        SingularFieldHelper<21>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x15:
      if ((*field != 0.0) || (NAN(*field))) goto LAB_0025b823;
      break;
    case 0x16:
      if ((*(float *)field != 0.0) || (NAN(*(float *)field))) goto LAB_0025b774;
      break;
    case 0x17:
      if (*field != 0.0) goto LAB_0025b483;
      break;
    case 0x18:
      if (*field != 0.0) goto LAB_0025b503;
      break;
    case 0x19:
      fVar1 = *(float *)field;
joined_r0x0025b3f7:
      if (fVar1 != 0.0) {
LAB_0025b529:
        SingularFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x1a:
      if (*field != 0.0) goto LAB_0025b611;
      break;
    case 0x1b:
      fVar1 = *(float *)field;
joined_r0x0025b3e9:
      if (fVar1 != 0.0) {
LAB_0025b5f7:
        SingularFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x1c:
      if (*(char *)field != '\0') goto LAB_0025b418;
      break;
    case 0x1d:
    case 0x20:
      if (*(long *)((long)*field + 8) != 0) goto LAB_0025b113;
      break;
    case 0x1e:
      if (*field != 0.0) goto LAB_0025b45d;
      break;
    case 0x1f:
      if (*field != 0.0) goto LAB_0025b7de;
      break;
    case 0x21:
      fVar1 = *(float *)field;
joined_r0x0025b4f2:
      if (fVar1 != 0.0) {
LAB_0025b54f:
        SingularFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x22:
      fVar1 = *(float *)field;
joined_r0x0025b2e6:
      if (fVar1 != 0.0) {
LAB_0025b6a2:
        SingularFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x23:
      fVar1 = *(float *)field;
joined_r0x0025b3b1:
      if (fVar1 != 0.0) {
LAB_0025b662:
        SingularFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x24:
      if (*field != 0.0) goto LAB_0025b841;
      break;
    case 0x25:
      fVar1 = *(float *)field;
joined_r0x0025b7a7:
      if (fVar1 != 0.0) {
LAB_0025b7ad:
        SingularFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x26:
      if (*field != 0.0) goto LAB_0025b6d7;
      break;
    case 0x29:
      if (field[1] != 0.0) goto LAB_0025b62c;
      break;
    case 0x2a:
      RepeatedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2b:
      RepeatedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2c:
      RepeatedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2d:
      RepeatedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2e:
      RepeatedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x2f:
      RepeatedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x30:
      RepeatedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x31:
      RepeatedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x32:
    case 0x35:
    case 0x3e:
      RepeatedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x33:
      RepeatedFieldHelper<10>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x34:
      RepeatedFieldHelper<11>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x36:
      RepeatedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x37:
      RepeatedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x38:
      RepeatedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x39:
      RepeatedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3a:
      RepeatedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3b:
      RepeatedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x3f:
      PackedFieldHelper<1>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x40:
      PackedFieldHelper<2>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x41:
      PackedFieldHelper<3>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x42:
      PackedFieldHelper<4>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x43:
      PackedFieldHelper<5>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x44:
      PackedFieldHelper<6>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x45:
      PackedFieldHelper<7>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x46:
      PackedFieldHelper<8>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x53:
      PackedFieldHelper<9>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4b:
      PackedFieldHelper<13>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4c:
      PackedFieldHelper<14>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4d:
      PackedFieldHelper<15>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4e:
      PackedFieldHelper<16>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x4f:
      PackedFieldHelper<17>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x50:
      PackedFieldHelper<18>::Serialize<google::protobuf::io::CodedOutputStream>
                (field,field_metadata_table,output);
      break;
    case 0x54:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b823;
      break;
    case 0x55:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b774;
      break;
    case 0x56:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b483;
      break;
    case 0x57:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b503;
      break;
    case 0x58:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b529;
    case 0x59:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b611;
      break;
    case 0x5a:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b5f7;
    case 0x5b:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b418;
      break;
    case 0x5c:
    case 0x5f:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b113;
      break;
    case 0x5d:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b45d;
      break;
    case 0x5e:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b7de;
      break;
    case 0x60:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b54f;
    case 0x61:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b6a2;
    case 0x62:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b662;
    case 99:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b841;
      break;
    case 100:
      if (*(uint *)(base + field_metadata_table->has_offset) != field_metadata_table->tag >> 3)
      break;
      goto LAB_0025b7ad;
    case 0x65:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3)
      goto LAB_0025b6d7;
      break;
    case 0x68:
      if (*(uint *)(base + field_metadata_table->has_offset) == field_metadata_table->tag >> 3) {
        OneOfFieldHelper<21>::Serialize<google::protobuf::io::CodedOutputStream>
                  (field,field_metadata_table,output);
      }
      break;
    case 0x69:
      (*(code *)field_metadata_table->ptr)
                (base,(ulong)field_metadata_table->offset,field_metadata_table->tag,
                 field_metadata_table->has_offset,output);
    }
LAB_0025b855:
    field_metadata_table = field_metadata_table + 1;
  } while( true );
}

Assistant:

void SerializeInternal(const uint8* base,
                       const FieldMetadata* field_metadata_table,
                       int32 num_fields, io::CodedOutputStream* output) {
  SpecialSerializer func = nullptr;
  for (int i = 0; i < num_fields; i++) {
    const FieldMetadata& field_metadata = field_metadata_table[i];
    const uint8* ptr = base + field_metadata.offset;
    switch (field_metadata.type) {
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_DOUBLE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FLOAT);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_INT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_FIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BOOL);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_STRING);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_GROUP);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_MESSAGE);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_BYTES);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_UINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_ENUM);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SFIXED64);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT32);
      SERIALIZERS_FOR_TYPE(WireFormatLite::TYPE_SINT64);
      SERIALIZERS_FOR_TYPE(FieldMetadata::kInlinedType);

      // Special cases
      case FieldMetadata::kSpecial:
        func = reinterpret_cast<SpecialSerializer>(
            const_cast<void*>(field_metadata.ptr));
        func(base, field_metadata.offset, field_metadata.tag,
             field_metadata.has_offset, output);
        break;
      default:
        // __builtin_unreachable()
        SerializeNotImplemented(field_metadata.type);
    }
  }
}